

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<mp::obj::Type> * testing::A<mp::obj::Type>(void)

{
  MatcherInterface<mp::obj::Type> *pMVar1;
  Matcher<mp::obj::Type> *in_RDI;
  
  pMVar1 = (MatcherInterface<mp::obj::Type> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_002b4ca0;
  (in_RDI->super_MatcherBase<mp::obj::Type>).impl_.value_ = pMVar1;
  (in_RDI->super_MatcherBase<mp::obj::Type>).impl_.link_.next_ =
       &(in_RDI->super_MatcherBase<mp::obj::Type>).impl_.link_;
  (in_RDI->super_MatcherBase<mp::obj::Type>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002b1dd0;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }